

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_digest.c
# Opt level: O0

int do_mac(int iter,EVP_MAC *mac,char *plaintext,hash_testvec *t)

{
  undefined1 *puVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  uint in_EDI;
  uchar out [256];
  size_t len;
  size_t outsize;
  EVP_MAC_CTX *ctx;
  OSSL_PARAM *p;
  OSSL_PARAM params [4];
  size_t acpkm_t;
  size_t acpkm;
  size_t in_stack_fffffffffffffd88;
  void *in_stack_fffffffffffffd90;
  ulong local_170;
  undefined1 local_168 [40];
  ulong local_140;
  long local_138;
  undefined1 local_130 [40];
  undefined1 local_108 [40];
  undefined1 *local_e0;
  undefined1 local_d8 [40];
  undefined1 auStack_b0 [128];
  long local_30;
  long local_28;
  long local_20;
  undefined8 local_18;
  undefined8 local_10;
  uint local_8;
  uint local_4;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (in_EDI == 0) {
    printf("[MAC %zu] ");
  }
  local_28 = (long)*(int *)(local_20 + 0x4c);
  local_30 = (long)*(int *)(local_20 + 0x50);
  memset(local_d8,0,0xa0);
  local_e0 = local_d8;
  if (local_28 != 0) {
    local_e0 = auStack_b0;
    OSSL_PARAM_construct_size_t(local_108,"key-mesh",&local_28);
    memcpy(local_d8,local_108,0x28);
    puVar1 = local_e0;
    if (local_30 != 0) {
      local_e0 = local_e0 + 0x28;
      OSSL_PARAM_construct_size_t(local_130,"cipher-key-mesh",&local_30);
      memcpy(puVar1,local_130,0x28);
    }
  }
  local_138 = EVP_MAC_CTX_new(local_10);
  if (local_138 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_MAC_CTX_new(mac)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x290);
  }
  if ((*(long *)(local_20 + 0x38) != 0) &&
     (lVar3 = EVP_MAC_CTX_get_mac_size(local_138), lVar3 != *(long *)(local_20 + 0x38))) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MAC_CTX_get_mac_size(ctx) == t->outsize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x292);
  }
  puVar1 = local_e0;
  if (*(int *)(local_20 + 0x40) == 0) {
    local_140 = EVP_MAC_CTX_get_mac_size(local_138);
  }
  else {
    local_140 = (ulong)*(int *)(local_20 + 0x40);
    local_e0 = local_e0 + 0x28;
    OSSL_PARAM_construct_size_t(local_168,"size",&local_140);
    memcpy(puVar1,local_168,0x28);
  }
  iVar2 = EVP_MAC_init(local_138,*(undefined8 *)(local_20 + 0x28),(long)*(int *)(local_20 + 0x44),0)
  ;
  if (iVar2 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x29b);
  }
  iVar2 = EVP_MAC_CTX_set_params(local_138,local_d8);
  if (iVar2 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MAC_CTX_set_params(ctx, params)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x29c);
  }
  iVar2 = EVP_MAC_update(local_138,local_18,(long)*(int *)(local_20 + 0x30));
  if (iVar2 == 0) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x29d);
  }
  local_170 = 0;
  if (*(int *)(local_20 + 0x40) == 0) {
    uVar4 = EVP_MAC_CTX_get_mac_size(local_138);
    if (uVar4 != local_140) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MAC_CTX_get_mac_size(ctx) == outsize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x2a6);
    }
    iVar2 = EVP_MAC_final(local_138,&stack0xfffffffffffffd88,&local_170,0x100);
    if (iVar2 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MAC_final(ctx, out, &len, sizeof(out))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x2a7);
    }
  }
  else {
    if (0x100 < local_140) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("outsize <= sizeof(out)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x2a2);
    }
    iVar2 = EVP_MAC_finalXOF(local_138,&stack0xfffffffffffffd88,local_140);
    if (iVar2 == 0) {
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_MAC_finalXOF(ctx, out, outsize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                  ,0x2a3);
    }
    local_170 = local_140;
  }
  EVP_MAC_CTX_free(local_138);
  if (local_170 != local_140) {
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("len == outsize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_digest.c"
                ,0x2ab);
  }
  iVar2 = memcmp(&stack0xfffffffffffffd88,*(void **)(local_20 + 0x18),local_140);
  if (iVar2 != 0) {
    printf("\x1b[1;31mmac mismatch (iter %d, outsize %d)\x1b[m\n",(ulong)local_8,
           local_140 & 0xffffffff);
    hexdump(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    hexdump(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  local_4 = (uint)(iVar2 != 0);
  return local_4;
}

Assistant:

static int do_mac(int iter, EVP_MAC *mac, const char *plaintext,
                  const struct hash_testvec *t)
{
    if (!iter)
        printf("[MAC %zu] ", t->outsize);

    size_t acpkm = (size_t)t->acpkm;
    size_t acpkm_t = (size_t)t->acpkm_t;
    OSSL_PARAM params[] = { OSSL_PARAM_END, OSSL_PARAM_END, OSSL_PARAM_END, OSSL_PARAM_END };
    OSSL_PARAM *p = params;
    if (acpkm) {
        *p++ = OSSL_PARAM_construct_size_t("key-mesh", &acpkm);
        if (acpkm_t)
            *p++ = OSSL_PARAM_construct_size_t("cipher-key-mesh", &acpkm_t);
    }

    EVP_MAC_CTX *ctx;
    T(ctx = EVP_MAC_CTX_new(mac));
    if (t->outsize)
        T(EVP_MAC_CTX_get_mac_size(ctx) == t->outsize);
    size_t outsize;
    if (t->truncate) {
        outsize = t->truncate;
	*p++ = OSSL_PARAM_construct_size_t("size", &outsize);
    }
    else
        outsize = EVP_MAC_CTX_get_mac_size(ctx);

    T(EVP_MAC_init(ctx, (const unsigned char *)t->key, t->key_size, NULL));
    T(EVP_MAC_CTX_set_params(ctx, params));
    T(EVP_MAC_update(ctx, (unsigned char *)plaintext, t->psize));

    size_t len = 0;
    unsigned char out[256];
    if (t->truncate) {
        T(outsize <= sizeof(out));
        T(EVP_MAC_finalXOF(ctx, out, outsize));
        len = outsize;
    } else {
        T(EVP_MAC_CTX_get_mac_size(ctx) == outsize);
        T(EVP_MAC_final(ctx, out, &len, sizeof(out)));
    }

    EVP_MAC_CTX_free(ctx);
    T(len == outsize);
    if (memcmp(out, t->digest, outsize) != 0) {
        printf(cRED "mac mismatch (iter %d, outsize %d)" cNORM "\n",
               iter, (int)outsize);
        hexdump(t->digest, outsize);
        hexdump(out, outsize);
        return 1;
    }

    return 0;
}